

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# String.hpp
# Opt level: O1

void __thiscall stick::String::String(String *this,char *_c,Allocator *_alloc)

{
  int iVar1;
  size_t sVar2;
  undefined4 extraout_var;
  
  this->m_cStr = (char *)0x0;
  this->m_length = 0;
  this->m_capacity = 0;
  this->m_allocator = _alloc;
  sVar2 = strlen(_c);
  if (sVar2 == 0) {
    return;
  }
  iVar1 = (*_alloc->_vptr_Allocator[2])(_alloc,sVar2 + 1,1);
  this->m_cStr = (char *)CONCAT44(extraout_var,iVar1);
  memset((char *)CONCAT44(extraout_var,iVar1),0,sVar2 + 1);
  if (this->m_cStr != (char *)0x0) {
    this->m_capacity = sVar2;
    this->m_length = sVar2;
    strcpy(this->m_cStr,_c);
    return;
  }
  __assert_fail("m_cStr != nullptr",
                "/workspace/llm4binary/github/license_all_cmakelists_25/mokafolio[P]Stick/Stick/String.hpp"
                ,0x1a0,"void stick::String::reserve(Size)");
}

Assistant:

inline String(const char * _c, Allocator & _alloc = defaultAllocator()) :
        m_cStr(nullptr),
        m_length(0),
        m_capacity(0),
        m_allocator(&_alloc)
    {
        Size l = strlen(_c);
        if (l)
        {
            resize(l);
            strcpy(m_cStr, _c);
        }
    }